

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O0

char * stb_stristr(char *s,char *t)

{
  int iVar1;
  size_t __n;
  char *__s1;
  char *z;
  size_t n;
  char *t_local;
  char *s_local;
  
  __n = strlen(t);
  t_local = s;
  s_local = s;
  if (__n != 0) {
    while (__s1 = stb_strichr(t_local,*t), __s1 != (char *)0x0) {
      iVar1 = strncasecmp(__s1,t,__n);
      if (iVar1 == 0) {
        return __s1;
      }
      t_local = __s1 + 1;
    }
    s_local = (char *)0x0;
  }
  return s_local;
}

Assistant:

char *stb_stristr(char *s, char *t)
{
   size_t n = strlen(t);
   char *z;
   if (n==0) return s;
   while ((z = stb_strichr(s, *t)) != NULL) {
      if (0==stb_strnicmp(z, t, n))
         return z;
      s = z+1;
   }
   return NULL;
}